

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O1

double Abc_GraphCountPaths(Vec_Wec_t *vNodes,Vec_Int_t *vEdges)

{
  Vec_Int_t *pVVar1;
  double **pCache;
  double *pdVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  int pBuffer [1000];
  int local_fd8 [1002];
  
  memset(local_fd8,0,4000);
  lVar6 = (long)vNodes->nSize;
  pCache = (double **)malloc(lVar6 * 8);
  if (0 < lVar6) {
    pVVar1 = vNodes->pArray;
    lVar5 = 0;
    do {
      lVar4 = (long)pVVar1[lVar5].nSize;
      pdVar2 = (double *)malloc(lVar4 * 8);
      pCache[lVar5] = pdVar2;
      if (0 < lVar4) {
        lVar3 = 0;
        do {
          pdVar2[lVar3] = -1.0;
          lVar3 = lVar3 + 1;
        } while (lVar4 != lVar3);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != lVar6);
  }
  dVar7 = Abc_GraphCountPaths_rec(0,0,vNodes,pCache,local_fd8,vEdges);
  if (0 < vNodes->nSize) {
    lVar6 = 0;
    do {
      if (pCache[lVar6] != (double *)0x0) {
        free(pCache[lVar6]);
        pCache[lVar6] = (double *)0x0;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < vNodes->nSize);
  }
  if (pCache != (double **)0x0) {
    free(pCache);
  }
  return dVar7;
}

Assistant:

double Abc_GraphCountPaths( Vec_Wec_t * vNodes, Vec_Int_t * vEdges )
{
    int i, k, pBuffer[1000] = {0};
    double ** pCache = ABC_ALLOC( double *, Vec_WecSize(vNodes) );
    Vec_Int_t * vLevel;   double Value;
    Vec_WecForEachLevel( vNodes, vLevel, i )
    {
        pCache[i] = ABC_ALLOC( double, Vec_IntSize(vLevel) );
        for ( k = 0; k < Vec_IntSize(vLevel); k++ )
            pCache[i][k] = -1.0;
    }
    Value = Abc_GraphCountPaths_rec( 0, 0, vNodes, pCache, pBuffer, vEdges );
    for ( i = 0; i < Vec_WecSize(vNodes); i++ )
        ABC_FREE( pCache[i] );
    ABC_FREE( pCache );
    return Value;
}